

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall
TPZVec<std::pair<int,_int>_>::Resize
          (TPZVec<std::pair<int,_int>_> *this,int64_t newsize,pair<int,_int> *object)

{
  pair<int,_int> pVar1;
  pair<int,_int> *ppVar2;
  pair<int,_int> *__s;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  
  if (-1 < newsize) {
    lVar5 = this->fNElements;
    if (lVar5 != newsize) {
      if (newsize == 0) {
        __s = (pair<int,_int> *)0x0;
      }
      else {
        __s = (pair<int,_int> *)operator_new__(-(ulong)((ulong)newsize >> 0x3d != 0) | newsize * 8);
        memset(__s,0,newsize * 8);
      }
      if (newsize <= lVar5) {
        lVar5 = newsize;
      }
      ppVar2 = this->fStore;
      lVar4 = 0;
      if (lVar5 < 1) {
        lVar5 = lVar4;
      }
      for (; lVar5 != lVar4; lVar4 = lVar4 + 1) {
        __s[lVar4] = ppVar2[lVar4];
      }
      pVar1 = *object;
      for (; lVar5 < newsize; lVar5 = lVar5 + 1) {
        __s[lVar5] = pVar1;
      }
      if (ppVar2 != (pair<int,_int> *)0x0) {
        operator_delete__(ppVar2);
      }
      this->fStore = __s;
      this->fNElements = newsize;
      this->fNAlloc = newsize;
    }
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}